

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void test_ecdsa_edge_cases(void)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  undefined8 uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  char cVar27;
  int iVar28;
  secp256k1_context *extraout_RAX;
  secp256k1_context *extraout_RAX_00;
  secp256k1_context *extraout_RAX_01;
  secp256k1_context *extraout_RAX_02;
  secp256k1_context *extraout_RAX_03;
  secp256k1_context *extraout_RAX_04;
  secp256k1_context *extraout_RAX_05;
  secp256k1_context *extraout_RAX_06;
  secp256k1_context *extraout_RAX_07;
  secp256k1_context *extraout_RAX_08;
  secp256k1_context *extraout_RAX_09;
  secp256k1_context *extraout_RAX_10;
  secp256k1_context *extraout_RAX_11;
  secp256k1_context *extraout_RAX_12;
  secp256k1_context *extraout_RAX_13;
  secp256k1_context *extraout_RAX_14;
  secp256k1_context *extraout_RAX_15;
  ulong uVar29;
  long lVar30;
  long lVar31;
  secp256k1_scalar *r;
  secp256k1_scalar *a;
  uchar *p1;
  char *pcVar32;
  byte *pbVar33;
  secp256k1_context *psVar34;
  code *in_R8;
  char *pcVar35;
  secp256k1_ge *signature;
  secp256k1_gej *r_00;
  secp256k1_scalar sr;
  size_t siglen;
  secp256k1_scalar ss;
  secp256k1_scalar msg;
  secp256k1_scalar ss_2;
  secp256k1_ecdsa_signature sig;
  uchar msg_3 [32];
  secp256k1_gej keyj;
  undefined1 local_4178 [8];
  undefined8 uStack_4170;
  undefined1 auStack_4168 [16];
  size_t local_4150;
  undefined1 local_4148 [4];
  undefined1 auStack_4144 [12];
  undefined1 auStack_4138 [16];
  undefined1 local_4128 [4];
  undefined1 auStack_4124 [12];
  uint64_t local_4118;
  uint64_t uStack_4110;
  uint64_t local_4108;
  uint64_t uStack_4100;
  uint64_t local_40f8;
  uint64_t uStack_40f0;
  secp256k1_scalar local_40e8;
  secp256k1_ge local_40c8;
  byte local_4068 [40];
  ulong local_4040;
  secp256k1_gej local_4038 [64];
  uint64_t auStack_2038 [1025];
  
  signature = (secp256k1_ge *)local_4178;
  a = (secp256k1_scalar *)local_4178;
  r = (secp256k1_scalar *)local_4148;
  _local_4148 = ZEXT816(1);
  auStack_4138 = ZEXT816(0);
  secp256k1_scalar_negate(r,r);
  secp256k1_scalar_inverse(r,r);
  _local_4178 = (secp256k1_callback)ZEXT816(1);
  auStack_4168 = ZEXT816(0);
  r_00 = local_4038;
  secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,r_00,(secp256k1_scalar *)local_4178);
  secp256k1_ge_set_gej(&local_40c8,r_00);
  local_4118 = auStack_4138._0_8_;
  uStack_4110 = auStack_4138._8_8_;
  _local_4128 = _local_4148;
  iVar28 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4178,r,&local_40c8,(secp256k1_scalar *)local_4128);
  if (iVar28 != 0) goto LAB_0016f9ed;
  _local_4178 = (secp256k1_callback)ZEXT816(1);
  auStack_4168 = ZEXT816(0);
  local_40c8.x.n[0] = 0;
  local_40c8.x.n[1] = 0;
  local_40c8.x.n[2] = 0;
  local_40c8.x.n[3] = 0;
  _local_4128 = ZEXT816(0);
  local_4118 = 0;
  uStack_4110 = 0;
  iVar28 = secp256k1_eckey_pubkey_parse((secp256k1_ge *)local_4038,&DAT_0018bee0,0x21);
  signature = (secp256k1_ge *)local_4178;
  if (iVar28 == 0) goto LAB_0016f9f2;
  iVar28 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4128,(secp256k1_scalar *)local_4178,
                      (secp256k1_ge *)local_4038,(secp256k1_scalar *)&local_40c8);
  signature = (secp256k1_ge *)local_4178;
  if (iVar28 != 0) goto LAB_0016f9f7;
  local_40c8.x.n[1] = 0;
  local_40c8.x.n[2] = 0;
  local_40c8.x.n[3] = 0;
  local_40c8.x.n[0] = 2;
  local_40c8.x.n[4]._0_1_ = 1;
  auStack_4138 = ZEXT816(0);
  _local_4148 = ZEXT816(0);
  _local_4128 = ZEXT816(0);
  local_4118 = 0;
  uStack_4110 = 0;
  _local_4178 = (secp256k1_callback)ZEXT816(1);
  auStack_4168 = ZEXT816(0);
  iVar28 = secp256k1_eckey_pubkey_parse((secp256k1_ge *)local_4038,(uchar *)&local_40c8,0x21);
  signature = (secp256k1_ge *)local_4178;
  if (iVar28 == 0) goto LAB_0016f9fc;
  iVar28 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4178,(secp256k1_scalar *)local_4148,
                      (secp256k1_ge *)local_4038,(secp256k1_scalar *)local_4128);
  signature = (secp256k1_ge *)local_4178;
  if (iVar28 != 0) goto LAB_0016fa01;
  local_4118 = 0;
  uStack_4110 = 0;
  stack0xffffffffffffbed9 = ZEXT715(0);
  local_4128[0] = 2;
  local_4108 = CONCAT71(local_4108._1_7_,2);
  local_40e8.d[0] = 2;
  local_40e8.d[1] = 0;
  local_40e8.d[2] = 0;
  local_40e8.d[3] = 0;
  _local_4178 = (secp256k1_callback)ZEXT816(0);
  auStack_4168 = ZEXT816(0);
  _local_4148 = ZEXT816(2);
  auStack_4138 = ZEXT816(0);
  iVar28 = secp256k1_eckey_pubkey_parse((secp256k1_ge *)local_4038,local_4128,0x21);
  signature = (secp256k1_ge *)local_4178;
  if (iVar28 == 0) goto LAB_0016fa06;
  iVar28 = secp256k1_eckey_pubkey_parse(&local_40c8,&DAT_0018bf10,0x21);
  signature = (secp256k1_ge *)local_4178;
  if (iVar28 == 0) goto LAB_0016fa0b;
  iVar28 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4148,&local_40e8,(secp256k1_ge *)local_4038,
                      (secp256k1_scalar *)local_4178);
  signature = (secp256k1_ge *)local_4178;
  if (iVar28 == 0) goto LAB_0016fa10;
  iVar28 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4148,&local_40e8,&local_40c8,
                      (secp256k1_scalar *)local_4178);
  signature = (secp256k1_ge *)local_4178;
  if (iVar28 == 0) goto LAB_0016fa15;
  r = &local_40e8;
  secp256k1_scalar_negate(r,r);
  iVar28 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4148,r,(secp256k1_ge *)local_4038,
                      (secp256k1_scalar *)local_4178);
  signature = (secp256k1_ge *)local_4178;
  if (iVar28 == 0) goto LAB_0016fa1a;
  iVar28 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4148,&local_40e8,&local_40c8,
                      (secp256k1_scalar *)local_4178);
  signature = (secp256k1_ge *)local_4178;
  if (iVar28 == 0) goto LAB_0016fa1f;
  local_40e8.d[0] = 1;
  local_40e8.d[1] = 0;
  local_40e8.d[2] = 0;
  local_40e8.d[3] = 0;
  iVar28 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4148,&local_40e8,(secp256k1_ge *)local_4038,
                      (secp256k1_scalar *)local_4178);
  signature = (secp256k1_ge *)local_4178;
  if (iVar28 != 0) goto LAB_0016fa24;
  iVar28 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4148,&local_40e8,&local_40c8,
                      (secp256k1_scalar *)local_4178);
  signature = (secp256k1_ge *)local_4178;
  if (iVar28 != 0) goto LAB_0016fa29;
  _local_4148 = ZEXT816(1);
  auStack_4138 = ZEXT816(0);
  _local_4128 = ZEXT816(1);
  local_4118 = 0;
  uStack_4110 = 0;
  secp256k1_scalar_set_b32((secp256k1_scalar *)local_4178,"",(int *)0x0);
  iVar28 = secp256k1_eckey_pubkey_parse((secp256k1_ge *)local_4038,&DAT_0018bf40,0x21);
  signature = (secp256k1_ge *)local_4178;
  if (iVar28 == 0) goto LAB_0016fa2e;
  iVar28 = secp256k1_eckey_pubkey_parse(&local_40c8,&DAT_0018bf70,0x21);
  signature = (secp256k1_ge *)local_4178;
  if (iVar28 == 0) goto LAB_0016fa33;
  iVar28 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4178,(secp256k1_scalar *)local_4148,
                      (secp256k1_ge *)local_4038,(secp256k1_scalar *)local_4128);
  signature = (secp256k1_ge *)local_4178;
  if (iVar28 == 0) goto LAB_0016fa38;
  iVar28 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4178,(secp256k1_scalar *)local_4148,&local_40c8,
                      (secp256k1_scalar *)local_4128);
  signature = (secp256k1_ge *)local_4178;
  if (iVar28 == 0) goto LAB_0016fa3d;
  r = (secp256k1_scalar *)local_4148;
  secp256k1_scalar_negate(r,r);
  iVar28 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4178,r,(secp256k1_ge *)local_4038,
                      (secp256k1_scalar *)local_4128);
  signature = (secp256k1_ge *)local_4178;
  if (iVar28 == 0) goto LAB_0016fa42;
  iVar28 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4178,(secp256k1_scalar *)local_4148,&local_40c8,
                      (secp256k1_scalar *)local_4128);
  signature = (secp256k1_ge *)local_4178;
  if (iVar28 == 0) goto LAB_0016fa47;
  _local_4148 = ZEXT816(2);
  auStack_4138 = ZEXT816(0);
  r = (secp256k1_scalar *)local_4148;
  secp256k1_scalar_inverse_var(r,r);
  iVar28 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4178,r,(secp256k1_ge *)local_4038,
                      (secp256k1_scalar *)local_4128);
  signature = (secp256k1_ge *)local_4178;
  if (iVar28 != 0) goto LAB_0016fa4c;
  r_00 = (secp256k1_gej *)local_4148;
  iVar28 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4178,(secp256k1_scalar *)r_00,&local_40c8,
                      (secp256k1_scalar *)local_4128);
  signature = (secp256k1_ge *)local_4178;
  if (iVar28 != 0) goto LAB_0016fa51;
  _local_4178 = (secp256k1_callback)ZEXT816(1);
  auStack_4168 = ZEXT816(0);
  local_40c8.x.n[0] = 1;
  local_40c8.x.n[1] = 0;
  local_40c8.x.n[2] = 0;
  local_40c8.x.n[3] = 0;
  secp256k1_scalar_negate((secp256k1_scalar *)&local_40c8,(secp256k1_scalar *)&local_40c8);
  secp256k1_scalar_set_b32((secp256k1_scalar *)local_4128,"",(int *)0x0);
  iVar28 = secp256k1_eckey_pubkey_parse((secp256k1_ge *)local_4038,&DAT_0018bfa0,0x21);
  signature = (secp256k1_ge *)local_4178;
  if (iVar28 == 0) goto LAB_0016fa56;
  iVar28 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4128,(secp256k1_scalar *)local_4178,
                      (secp256k1_ge *)local_4038,(secp256k1_scalar *)&local_40c8);
  signature = (secp256k1_ge *)local_4178;
  if (iVar28 == 0) goto LAB_0016fa5b;
  secp256k1_scalar_negate((secp256k1_scalar *)local_4178,(secp256k1_scalar *)local_4178);
  iVar28 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4128,(secp256k1_scalar *)local_4178,
                      (secp256k1_ge *)local_4038,(secp256k1_scalar *)&local_40c8);
  r = (secp256k1_scalar *)local_4178;
  signature = (secp256k1_ge *)local_4178;
  if (iVar28 == 0) goto LAB_0016fa60;
  _local_4178 = (secp256k1_callback)ZEXT816(3);
  auStack_4168 = ZEXT816(0);
  secp256k1_scalar_inverse_var((secp256k1_scalar *)local_4178,(secp256k1_scalar *)local_4178);
  signature = (secp256k1_ge *)local_4128;
  iVar28 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)signature,(secp256k1_scalar *)local_4178,
                      (secp256k1_ge *)local_4038,(secp256k1_scalar *)&local_40c8);
  if (iVar28 != 0) goto LAB_0016fa65;
  local_40e8.d[2]._0_1_ = '\0';
  local_40e8.d[2]._1_1_ = '\0';
  local_40e8.d[2]._2_1_ = '\0';
  local_40e8.d[2]._3_1_ = '\0';
  local_40e8.d[2]._4_1_ = '\0';
  local_40e8.d[2]._5_1_ = '\0';
  local_40e8.d[2]._6_1_ = '\0';
  local_40e8.d[2]._7_1_ = '\0';
  local_40e8.d[3]._0_1_ = '\0';
  local_40e8.d[3]._1_1_ = '\0';
  local_40e8.d[3]._2_1_ = '\0';
  local_40e8.d[3]._3_1_ = '\0';
  local_40e8.d[3]._4_1_ = '\0';
  local_40e8.d[3]._5_1_ = '\0';
  local_40e8.d[3]._6_1_ = '\0';
  local_40e8.d[3]._7_1_ = '\x01';
  local_40e8.d[0]._0_1_ = '\0';
  local_40e8.d[0]._1_1_ = '\0';
  local_40e8.d[0]._2_1_ = '\0';
  local_40e8.d[0]._3_1_ = '\0';
  local_40e8.d[0]._4_1_ = '\0';
  local_40e8.d[0]._5_1_ = '\0';
  local_40e8.d[0]._6_1_ = '\0';
  local_40e8.d[0]._7_1_ = '\0';
  local_40e8.d[1]._0_1_ = '\0';
  local_40e8.d[1]._1_1_ = '\0';
  local_40e8.d[1]._2_1_ = '\0';
  local_40e8.d[1]._3_1_ = '\0';
  local_40e8.d[1]._4_1_ = '\0';
  local_40e8.d[1]._5_1_ = '\0';
  local_40e8.d[1]._6_1_ = '\0';
  local_40e8.d[1]._7_1_ = '\0';
  local_4068[0x10] = 0xb8;
  local_4068[0x11] = 0x12;
  local_4068[0x12] = 0xe0;
  local_4068[0x13] = 0xb;
  local_4068[0x14] = 0x81;
  local_4068[0x15] = 0x7a;
  local_4068[0x16] = 0x77;
  local_4068[0x17] = 0x62;
  local_4068[0x18] = 0x65;
  local_4068[0x19] = 0xdf;
  local_4068[0x1a] = 0xdd;
  local_4068[0x1b] = 0x31;
  local_4068[0x1c] = 0xb9;
  local_4068[0x1d] = 0x3e;
  local_4068[0x1e] = 0x29;
  local_4068[0x1f] = 0xa9;
  local_4068[0] = 0x86;
  local_4068[1] = 0x41;
  local_4068[2] = 0x99;
  local_4068[3] = 0x81;
  local_4068[4] = 6;
  local_4068[5] = 0x23;
  local_4068[6] = 0x44;
  local_4068[7] = 0x53;
  local_4068[8] = 0xaa;
  local_4068[9] = 0x5f;
  local_4068[10] = 0x9d;
  local_4068[0xb] = 0x6a;
  local_4068[0xc] = 0x31;
  local_4068[0xd] = 0x78;
  local_4068[0xe] = 0xf4;
  local_4068[0xf] = 0xf7;
  in_R8 = precomputed_nonce_function;
  iVar28 = secp256k1_ecdsa_sign
                     (CTX,(secp256k1_ecdsa_signature *)&local_40c8,local_4068,(uchar *)&local_40e8,
                      precomputed_nonce_function,"");
  a = (secp256k1_scalar *)local_4178;
  if (iVar28 != 0) goto LAB_0016fa6a;
  in_R8 = precomputed_nonce_function;
  iVar28 = secp256k1_ecdsa_sign
                     (CTX,(secp256k1_ecdsa_signature *)&local_40c8,local_4068,(uchar *)&local_40e8,
                      precomputed_nonce_function,test_ecdsa_edge_cases::nonce2);
  a = (secp256k1_scalar *)local_4178;
  if (iVar28 != 0) goto LAB_0016fa6f;
  local_4068[0x1f] = 0xaa;
  in_R8 = precomputed_nonce_function;
  iVar28 = secp256k1_ecdsa_sign
                     (CTX,(secp256k1_ecdsa_signature *)&local_40c8,local_4068,(uchar *)&local_40e8,
                      precomputed_nonce_function,"");
  psVar34 = CTX;
  a = (secp256k1_scalar *)local_4178;
  if (iVar28 != 1) goto LAB_0016fa74;
  auVar7._12_4_ = 0;
  auVar7._0_12_ = auStack_4124;
  _local_4128 = auVar7 << 0x20;
  local_4038[0].x.n[0] = (uint64_t)(CTX->illegal_callback).fn;
  local_4038[0].x.n[1] = (uint64_t)(CTX->illegal_callback).data;
  a = (secp256k1_scalar *)local_4178;
  if (secp256k1_context_static == CTX) goto LAB_0016fa79;
  (CTX->illegal_callback).fn = counting_callback_fn;
  (psVar34->illegal_callback).data = signature;
  a = (secp256k1_scalar *)local_4178;
LAB_0016e6dd:
  pcVar32 = "signature != NULL";
  if ((CTX->ecmult_gen_ctx).built == 0) {
    pcVar32 = "secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx)";
  }
  (*(CTX->illegal_callback).fn)(pcVar32,(CTX->illegal_callback).data);
  psVar34 = CTX;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038[0].x.n[0];
  (psVar34->illegal_callback).data = (void *)local_4038[0].x.n[1];
  if (local_4128 == (undefined1  [4])0x1) {
    auVar8._12_4_ = 0;
    auVar8._0_12_ = auStack_4124;
    _local_4128 = auVar8 << 0x20;
    local_4038[0].x.n[0] = (uint64_t)(psVar34->illegal_callback).fn;
    local_4038[0].x.n[1] = (uint64_t)(psVar34->illegal_callback).data;
    if (secp256k1_context_static == psVar34) goto LAB_0016fa97;
    (psVar34->illegal_callback).fn = counting_callback_fn;
    (psVar34->illegal_callback).data = signature;
  }
  else {
    test_ecdsa_edge_cases_cold_12();
    psVar34 = extraout_RAX_00;
LAB_0016fa97:
    (*(psVar34->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar34->illegal_callback).data);
  }
  pcVar32 = "msghash32 != NULL";
  if ((CTX->ecmult_gen_ctx).built == 0) {
    pcVar32 = "secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx)";
  }
  (*(CTX->illegal_callback).fn)(pcVar32,(CTX->illegal_callback).data);
  psVar34 = CTX;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038[0].x.n[0];
  (psVar34->illegal_callback).data = (void *)local_4038[0].x.n[1];
  if (local_4128 == (undefined1  [4])0x1) {
    auVar9._12_4_ = 0;
    auVar9._0_12_ = auStack_4124;
    _local_4128 = auVar9 << 0x20;
    local_4038[0].x.n[0] = (uint64_t)(psVar34->illegal_callback).fn;
    local_4038[0].x.n[1] = (uint64_t)(psVar34->illegal_callback).data;
    if (secp256k1_context_static == psVar34) goto LAB_0016fab5;
    (psVar34->illegal_callback).fn = counting_callback_fn;
    (psVar34->illegal_callback).data = signature;
  }
  else {
    test_ecdsa_edge_cases_cold_13();
    psVar34 = extraout_RAX_01;
LAB_0016fab5:
    (*(psVar34->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar34->illegal_callback).data);
  }
  pcVar35 = "seckey != NULL";
  pcVar32 = "seckey != NULL";
  if ((CTX->ecmult_gen_ctx).built == 0) {
    pcVar32 = "secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx)";
  }
  (*(CTX->illegal_callback).fn)(pcVar32,(CTX->illegal_callback).data);
  psVar34 = CTX;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038[0].x.n[0];
  (psVar34->illegal_callback).data = (void *)local_4038[0].x.n[1];
  if (local_4128 == (undefined1  [4])0x1) {
    in_R8 = precomputed_nonce_function;
    iVar28 = secp256k1_ecdsa_sign
                       (psVar34,(secp256k1_ecdsa_signature *)&local_40c8,local_4068,
                        (uchar *)&local_40e8,precomputed_nonce_function,
                        test_ecdsa_edge_cases::nonce2);
    if (iVar28 != 1) goto LAB_0016fad3;
    iVar28 = secp256k1_ec_pubkey_create(CTX,(secp256k1_pubkey *)local_4128,(uchar *)&local_40e8);
    psVar34 = CTX;
    if (iVar28 == 0) goto LAB_0016fad8;
    auVar10._12_4_ = 0;
    auVar10._0_12_ = stack0xffffffffffffbe8c;
    _local_4178 = (secp256k1_callback)(auVar10 << 0x20);
    local_4038[0].x.n[0] = (uint64_t)(CTX->illegal_callback).fn;
    local_4038[0].x.n[1] = (uint64_t)(CTX->illegal_callback).data;
    if (secp256k1_context_static == CTX) goto LAB_0016fadd;
    (CTX->illegal_callback).fn = counting_callback_fn;
    (psVar34->illegal_callback).data = a;
  }
  else {
    test_ecdsa_edge_cases_cold_14();
LAB_0016fad3:
    test_ecdsa_edge_cases_cold_15();
LAB_0016fad8:
    test_ecdsa_edge_cases_cold_66();
    psVar34 = extraout_RAX_02;
LAB_0016fadd:
    (*(psVar34->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar34->illegal_callback).data);
  }
  (*(CTX->illegal_callback).fn)("sig != NULL",(CTX->illegal_callback).data);
  psVar34 = CTX;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038[0].x.n[0];
  (psVar34->illegal_callback).data = (void *)local_4038[0].x.n[1];
  if (local_4178._0_4_ == 1) {
    auVar11._12_4_ = 0;
    auVar11._0_12_ = stack0xffffffffffffbe8c;
    _local_4178 = (secp256k1_callback)(auVar11 << 0x20);
    local_4038[0].x.n[0] = (uint64_t)(psVar34->illegal_callback).fn;
    local_4038[0].x.n[1] = (uint64_t)(psVar34->illegal_callback).data;
    if (secp256k1_context_static == psVar34) goto LAB_0016fafb;
    (psVar34->illegal_callback).fn = counting_callback_fn;
    (psVar34->illegal_callback).data = a;
  }
  else {
    test_ecdsa_edge_cases_cold_16();
    psVar34 = extraout_RAX_03;
LAB_0016fafb:
    (*(psVar34->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar34->illegal_callback).data);
  }
  (*(CTX->illegal_callback).fn)("msghash32 != NULL",(CTX->illegal_callback).data);
  psVar34 = CTX;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038[0].x.n[0];
  (psVar34->illegal_callback).data = (void *)local_4038[0].x.n[1];
  if (local_4178._0_4_ == 1) {
    auVar12._12_4_ = 0;
    auVar12._0_12_ = stack0xffffffffffffbe8c;
    _local_4178 = (secp256k1_callback)(auVar12 << 0x20);
    local_4038[0].x.n[0] = (uint64_t)(psVar34->illegal_callback).fn;
    local_4038[0].x.n[1] = (uint64_t)(psVar34->illegal_callback).data;
    if (secp256k1_context_static == psVar34) goto LAB_0016fb19;
    (psVar34->illegal_callback).fn = counting_callback_fn;
    (psVar34->illegal_callback).data = a;
  }
  else {
    test_ecdsa_edge_cases_cold_17();
    psVar34 = extraout_RAX_04;
LAB_0016fb19:
    (*(psVar34->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar34->illegal_callback).data);
  }
  (*(CTX->illegal_callback).fn)("pubkey != NULL",(CTX->illegal_callback).data);
  psVar34 = CTX;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038[0].x.n[0];
  (psVar34->illegal_callback).data = (void *)local_4038[0].x.n[1];
  if (local_4178._0_4_ == 1) {
    iVar28 = secp256k1_ecdsa_verify
                       (psVar34,(secp256k1_ecdsa_signature *)&local_40c8,local_4068,
                        (secp256k1_pubkey *)local_4128);
    psVar34 = CTX;
    if (iVar28 == 0) goto LAB_0016fb37;
    auVar13._12_4_ = 0;
    auVar13._0_12_ = stack0xffffffffffffbe8c;
    _local_4178 = (secp256k1_callback)(auVar13 << 0x20);
    local_4038[0].x.n[0] = (uint64_t)(CTX->illegal_callback).fn;
    local_4038[0].x.n[1] = (uint64_t)(CTX->illegal_callback).data;
    if (secp256k1_context_static == CTX) goto LAB_0016fb3c;
    (CTX->illegal_callback).fn = counting_callback_fn;
    (psVar34->illegal_callback).data = a;
  }
  else {
    test_ecdsa_edge_cases_cold_18();
LAB_0016fb37:
    test_ecdsa_edge_cases_cold_65();
    psVar34 = extraout_RAX_05;
LAB_0016fb3c:
    (*(psVar34->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar34->illegal_callback).data);
  }
  _local_4128 = ZEXT816(0);
  local_4118 = 0;
  uStack_4110 = 0;
  local_4108 = 0;
  uStack_4100 = 0;
  local_40f8 = 0;
  uStack_40f0 = 0;
  if ((CTX->ecmult_gen_ctx).built == 0) {
    pcVar35 = "secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx)";
  }
  (*(CTX->illegal_callback).fn)(pcVar35,(CTX->illegal_callback).data);
  psVar34 = CTX;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038[0].x.n[0];
  (psVar34->illegal_callback).data = (void *)local_4038[0].x.n[1];
  if (local_4178._0_4_ == 1) {
    auVar14._12_4_ = 0;
    auVar14._0_12_ = stack0xffffffffffffbe8c;
    _local_4178 = (secp256k1_callback)(auVar14 << 0x20);
    local_4038[0].x.n[0] = (uint64_t)(psVar34->illegal_callback).fn;
    local_4038[0].x.n[1] = (uint64_t)(psVar34->illegal_callback).data;
    if (secp256k1_context_static == psVar34) goto LAB_0016fb5a;
    (psVar34->illegal_callback).fn = counting_callback_fn;
    (psVar34->illegal_callback).data = a;
  }
  else {
    test_ecdsa_edge_cases_cold_19();
    psVar34 = extraout_RAX_06;
LAB_0016fb5a:
    (*(psVar34->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar34->illegal_callback).data);
  }
  iVar28 = secp256k1_ecdsa_verify
                     (CTX,(secp256k1_ecdsa_signature *)&local_40c8,local_4068,
                      (secp256k1_pubkey *)local_4128);
  psVar34 = CTX;
  if (iVar28 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038[0].x.n[0];
    (psVar34->illegal_callback).data = (void *)local_4038[0].x.n[1];
    if (local_4178._0_4_ != 1) goto LAB_0016fb78;
    local_4150 = 0x48;
    auVar15._12_4_ = 0;
    auVar15._0_12_ = stack0xffffffffffffbe8c;
    _local_4178 = (secp256k1_callback)(auVar15 << 0x20);
    local_4038[0].x.n[0] = (uint64_t)(psVar34->illegal_callback).fn;
    local_4038[0].x.n[1] = (uint64_t)(psVar34->illegal_callback).data;
    if (secp256k1_context_static == psVar34) goto LAB_0016fb7d;
    (psVar34->illegal_callback).fn = counting_callback_fn;
    (psVar34->illegal_callback).data = a;
  }
  else {
    test_ecdsa_edge_cases_cold_20();
LAB_0016fb78:
    test_ecdsa_edge_cases_cold_21();
    psVar34 = extraout_RAX_07;
LAB_0016fb7d:
    (*(psVar34->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar34->illegal_callback).data);
  }
  (*(CTX->illegal_callback).fn)("output != NULL",(CTX->illegal_callback).data);
  psVar34 = CTX;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038[0].x.n[0];
  (psVar34->illegal_callback).data = (void *)local_4038[0].x.n[1];
  if (local_4178._0_4_ == 1) {
    auVar16._12_4_ = 0;
    auVar16._0_12_ = stack0xffffffffffffbe8c;
    _local_4178 = (secp256k1_callback)(auVar16 << 0x20);
    local_4038[0].x.n[0] = (uint64_t)(psVar34->illegal_callback).fn;
    local_4038[0].x.n[1] = (uint64_t)(psVar34->illegal_callback).data;
    if (secp256k1_context_static == psVar34) goto LAB_0016fb9b;
    (psVar34->illegal_callback).fn = counting_callback_fn;
    (psVar34->illegal_callback).data = a;
  }
  else {
    test_ecdsa_edge_cases_cold_22();
    psVar34 = extraout_RAX_08;
LAB_0016fb9b:
    (*(psVar34->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar34->illegal_callback).data);
  }
  (*(CTX->illegal_callback).fn)("outputlen != NULL",(CTX->illegal_callback).data);
  psVar34 = CTX;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038[0].x.n[0];
  (psVar34->illegal_callback).data = (void *)local_4038[0].x.n[1];
  if (local_4178._0_4_ == 1) {
    auVar17._12_4_ = 0;
    auVar17._0_12_ = stack0xffffffffffffbe8c;
    _local_4178 = (secp256k1_callback)(auVar17 << 0x20);
    local_4038[0].x.n[0] = (uint64_t)(psVar34->illegal_callback).fn;
    local_4038[0].x.n[1] = (uint64_t)(psVar34->illegal_callback).data;
    if (secp256k1_context_static == psVar34) goto LAB_0016fbb9;
    (psVar34->illegal_callback).fn = counting_callback_fn;
    (psVar34->illegal_callback).data = a;
  }
  else {
    test_ecdsa_edge_cases_cold_23();
    psVar34 = extraout_RAX_09;
LAB_0016fbb9:
    (*(psVar34->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar34->illegal_callback).data);
  }
  (*(CTX->illegal_callback).fn)("sig != NULL",(CTX->illegal_callback).data);
  psVar34 = CTX;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038[0].x.n[0];
  (psVar34->illegal_callback).data = (void *)local_4038[0].x.n[1];
  if (local_4178._0_4_ == 1) {
    iVar28 = secp256k1_ecdsa_signature_serialize_der
                       (psVar34,(uchar *)local_4038,&local_4150,
                        (secp256k1_ecdsa_signature *)&local_40c8);
    psVar34 = CTX;
    if (iVar28 == 0) goto LAB_0016fbd7;
    auVar18._12_4_ = 0;
    auVar18._0_12_ = auStack_4144;
    _local_4148 = auVar18 << 0x20;
    _local_4178 = CTX->illegal_callback;
    if (secp256k1_context_static == CTX) goto LAB_0016fbdc;
    (CTX->illegal_callback).fn = counting_callback_fn;
    (psVar34->illegal_callback).data = r_00;
  }
  else {
    test_ecdsa_edge_cases_cold_24();
LAB_0016fbd7:
    test_ecdsa_edge_cases_cold_64();
    psVar34 = extraout_RAX_10;
LAB_0016fbdc:
    (*(psVar34->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar34->illegal_callback).data);
  }
  (*(CTX->illegal_callback).fn)("sig != NULL",(CTX->illegal_callback).data);
  psVar34 = CTX;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4178;
  (psVar34->illegal_callback).data = uStack_4170;
  if (local_4148 == (undefined1  [4])0x1) {
    auVar19._12_4_ = 0;
    auVar19._0_12_ = auStack_4144;
    _local_4148 = auVar19 << 0x20;
    _local_4178 = psVar34->illegal_callback;
    if (secp256k1_context_static == psVar34) goto LAB_0016fbfa;
    (psVar34->illegal_callback).fn = counting_callback_fn;
    (psVar34->illegal_callback).data = r_00;
  }
  else {
    test_ecdsa_edge_cases_cold_25();
    psVar34 = extraout_RAX_11;
LAB_0016fbfa:
    (*(psVar34->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar34->illegal_callback).data);
  }
  (*(CTX->illegal_callback).fn)("input != NULL",(CTX->illegal_callback).data);
  psVar34 = CTX;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4178;
  (psVar34->illegal_callback).data = uStack_4170;
  if (local_4148 == (undefined1  [4])0x1) {
    iVar28 = secp256k1_ecdsa_signature_parse_der
                       (psVar34,(secp256k1_ecdsa_signature *)&local_40c8,(uchar *)local_4038,
                        local_4150);
    if (iVar28 == 0) goto LAB_0016fc18;
    local_4150 = 10;
    iVar28 = secp256k1_ecdsa_signature_serialize_der
                       (CTX,(uchar *)local_4038,&local_4150,(secp256k1_ecdsa_signature *)&local_40c8
                       );
    psVar34 = CTX;
    if (iVar28 != 0) goto LAB_0016fc1d;
    auVar20._12_4_ = 0;
    auVar20._0_12_ = auStack_4144;
    _local_4148 = auVar20 << 0x20;
    _local_4178 = CTX->illegal_callback;
    if (secp256k1_context_static == CTX) goto LAB_0016fc22;
    (CTX->illegal_callback).fn = counting_callback_fn;
    (psVar34->illegal_callback).data = r_00;
  }
  else {
    test_ecdsa_edge_cases_cold_26();
LAB_0016fc18:
    test_ecdsa_edge_cases_cold_63();
LAB_0016fc1d:
    test_ecdsa_edge_cases_cold_27();
    psVar34 = extraout_RAX_12;
LAB_0016fc22:
    (*(psVar34->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar34->illegal_callback).data);
  }
  (*(CTX->illegal_callback).fn)("sigin != NULL",(CTX->illegal_callback).data);
  psVar34 = CTX;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4178;
  (psVar34->illegal_callback).data = uStack_4170;
  if (local_4148 == (undefined1  [4])0x1) {
    auVar21._12_4_ = 0;
    auVar21._0_12_ = auStack_4144;
    _local_4148 = auVar21 << 0x20;
    _local_4178 = psVar34->illegal_callback;
    if (secp256k1_context_static == psVar34) goto LAB_0016fc40;
    (psVar34->illegal_callback).fn = counting_callback_fn;
    (psVar34->illegal_callback).data = r_00;
  }
  else {
    test_ecdsa_edge_cases_cold_28();
    psVar34 = extraout_RAX_13;
LAB_0016fc40:
    (*(psVar34->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar34->illegal_callback).data);
  }
  (*(CTX->illegal_callback).fn)("output64 != NULL",(CTX->illegal_callback).data);
  psVar34 = CTX;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4178;
  (psVar34->illegal_callback).data = uStack_4170;
  if (local_4148 == (undefined1  [4])0x1) {
    auVar22._12_4_ = 0;
    auVar22._0_12_ = auStack_4144;
    _local_4148 = auVar22 << 0x20;
    _local_4178 = psVar34->illegal_callback;
    if (secp256k1_context_static == psVar34) goto LAB_0016fc5e;
    (psVar34->illegal_callback).fn = counting_callback_fn;
    (psVar34->illegal_callback).data = r_00;
  }
  else {
    test_ecdsa_edge_cases_cold_29();
    psVar34 = extraout_RAX_14;
LAB_0016fc5e:
    (*(psVar34->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar34->illegal_callback).data);
  }
  (*(CTX->illegal_callback).fn)("sig != NULL",(CTX->illegal_callback).data);
  psVar34 = CTX;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4178;
  (psVar34->illegal_callback).data = uStack_4170;
  if (local_4148 == (undefined1  [4])0x1) {
    stack0xffffffffffffbeb9 = local_40c8.x.n[4]._1_7_;
    local_4148[0] = (undefined1)local_40c8.x.n[4];
    local_4178 = (undefined1  [8])local_40c8.x.n[0];
    uStack_4170 = (void *)local_40c8.x.n[1];
    auStack_4168._8_8_ = local_40c8.x.n[3];
    auStack_4168._0_8_ = local_40c8.x.n[2];
    a = (secp256k1_scalar *)local_4148;
    auStack_4144._4_8_ = local_40c8.y.n[0];
    auStack_4138._8_8_ = local_40c8.y.n[2];
    auStack_4138._0_8_ = local_40c8.y.n[1];
    secp256k1_scalar_get_b32((uchar *)local_4038,(secp256k1_scalar *)local_4178);
    secp256k1_scalar_get_b32((uchar *)(local_4038[0].x.n + 4),a);
    auVar23._12_4_ = 0;
    auVar23._0_12_ = auStack_4144;
    _local_4148 = auVar23 << 0x20;
    _local_4178 = psVar34->illegal_callback;
    if (secp256k1_context_static == psVar34) goto LAB_0016fc7c;
    (psVar34->illegal_callback).fn = counting_callback_fn;
    (psVar34->illegal_callback).data = a;
  }
  else {
    test_ecdsa_edge_cases_cold_30();
LAB_0016fc7c:
    (*(psVar34->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar34->illegal_callback).data);
  }
  (*(CTX->illegal_callback).fn)("sig != NULL",(CTX->illegal_callback).data);
  psVar34 = CTX;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4178;
  (psVar34->illegal_callback).data = uStack_4170;
  if (local_4148 == (undefined1  [4])0x1) {
    auVar24._12_4_ = 0;
    auVar24._0_12_ = auStack_4144;
    _local_4148 = auVar24 << 0x20;
    _local_4178 = psVar34->illegal_callback;
    if (secp256k1_context_static == psVar34) goto LAB_0016fc9b;
    (psVar34->illegal_callback).fn = counting_callback_fn;
    (psVar34->illegal_callback).data = a;
  }
  else {
    test_ecdsa_edge_cases_cold_31();
    psVar34 = extraout_RAX_15;
LAB_0016fc9b:
    (*(psVar34->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar34->illegal_callback).data);
  }
  (*(CTX->illegal_callback).fn)("input64 != NULL",(CTX->illegal_callback).data);
  psVar34 = CTX;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4178;
  (psVar34->illegal_callback).data = uStack_4170;
  if (local_4148 == (undefined1  [4])0x1) {
    iVar28 = secp256k1_ecdsa_signature_parse_compact
                       (psVar34,(secp256k1_ecdsa_signature *)&local_40c8,(uchar *)local_4038);
    if (iVar28 == 0) goto LAB_0016fcb9;
    local_4038[0].y.n[1]._0_4_ = 0xffffffff;
    local_4038[0].y.n[1]._4_4_ = 0xffffffff;
    local_4038[0].y.n[2]._0_4_ = 0xffffffff;
    local_4038[0].y.n[2]._4_4_ = 0xffffffff;
    local_4038[0].x.n[4] = 0xffffffffffffffff;
    local_4038[0].y.n[0] = 0xffffffffffffffff;
    local_4038[0].x.n[2] = 0xffffffffffffffff;
    local_4038[0].x.n[3] = 0xffffffffffffffff;
    local_4038[0].x.n[0] = 0xffffffffffffffff;
    local_4038[0].x.n[1] = 0xffffffffffffffff;
    psVar34 = CTX;
    iVar28 = secp256k1_ecdsa_signature_parse_compact
                       (CTX,(secp256k1_ecdsa_signature *)&local_40c8,(uchar *)local_4038);
    if (iVar28 == 0) {
      r_00 = (secp256k1_gej *)local_4148;
      uVar29 = 0;
      do {
        signature = &local_40c8;
        r = (secp256k1_scalar *)"";
        if ((int)uVar29 == 0) {
          r = (secp256k1_scalar *)0x0;
        }
        _local_4148 = (undefined1  [16])0x0;
        auStack_4138._0_15_ = SUB1615((undefined1  [16])0x0,0);
        auStack_4138[0xf] = 1;
        uStack_4170._0_4_ = 0xffffffff;
        local_4178 = (undefined1  [8])0xffffffffffffffff;
        uStack_4170._4_4_ = 0xffffffff;
        auStack_4168._8_4_ = 0xffffffff;
        auStack_4168._0_8_ = 0xffffffffffffffff;
        auStack_4168._12_4_ = 0xffffffff;
        in_R8 = (code *)0x0;
        local_4040 = uVar29;
        iVar28 = secp256k1_ecdsa_sign
                           (CTX,(secp256k1_ecdsa_signature *)signature,(uchar *)r_00,local_4178,
                            (secp256k1_nonce_function)0x0,r);
        if (iVar28 != 0) goto LAB_0016f9a7;
        lVar30 = 0;
        do {
          cVar27 = *(char *)((long)local_40c8.x.n + lVar30);
          if (cVar27 != '\0') goto LAB_0016f166;
          lVar30 = lVar30 + 1;
        } while (lVar30 != 0x40);
        cVar27 = '\0';
LAB_0016f166:
        if (cVar27 != '\0') goto LAB_0016f9ac;
        auStack_4168 = (undefined1  [16])0x0;
        local_4178 = (undefined1  [8])0x0;
        uStack_4170 = (void *)0x0;
        in_R8 = (code *)0x0;
        iVar28 = secp256k1_ecdsa_sign
                           (CTX,(secp256k1_ecdsa_signature *)signature,(uchar *)r_00,local_4178,
                            (secp256k1_nonce_function)0x0,r);
        if (iVar28 != 0) goto LAB_0016f9b1;
        lVar30 = 0;
        do {
          cVar27 = *(char *)((long)local_40c8.x.n + lVar30);
          if (cVar27 != '\0') goto LAB_0016f1b8;
          lVar30 = lVar30 + 1;
        } while (lVar30 != 0x40);
        cVar27 = '\0';
LAB_0016f1b8:
        if (cVar27 != '\0') goto LAB_0016f9b6;
        auStack_4168[0xf] = 1;
        in_R8 = nonce_function_test_fail;
        iVar28 = secp256k1_ecdsa_sign
                           (CTX,(secp256k1_ecdsa_signature *)signature,(uchar *)r_00,local_4178,
                            nonce_function_test_fail,r);
        if (iVar28 != 0) goto LAB_0016f9bb;
        lVar30 = 0;
        do {
          cVar27 = *(char *)((long)local_40c8.x.n + lVar30);
          if (cVar27 != '\0') goto LAB_0016f204;
          lVar30 = lVar30 + 1;
        } while (lVar30 != 0x40);
        cVar27 = '\0';
LAB_0016f204:
        if (cVar27 != '\0') goto LAB_0016f9c0;
        in_R8 = nonce_function_test_retry;
        iVar28 = secp256k1_ecdsa_sign
                           (CTX,(secp256k1_ecdsa_signature *)signature,(uchar *)r_00,local_4178,
                            nonce_function_test_retry,r);
        if (iVar28 != 1) goto LAB_0016f9c5;
        lVar30 = 0;
        do {
          cVar27 = *(char *)((long)local_40c8.x.n + lVar30);
          if (cVar27 != '\0') goto LAB_0016f250;
          lVar30 = lVar30 + 1;
        } while (lVar30 != 0x40);
        cVar27 = '\0';
LAB_0016f250:
        if (cVar27 == '\0') goto LAB_0016f9ca;
        in_R8 = nonce_function_rfc6979;
        iVar28 = secp256k1_ecdsa_sign
                           (CTX,(secp256k1_ecdsa_signature *)local_4128,(uchar *)r_00,local_4178,
                            nonce_function_rfc6979,r);
        if (iVar28 != 1) goto LAB_0016f9cf;
        lVar30 = 0;
        do {
          cVar27 = local_4128[lVar30];
          if (cVar27 != '\0') goto LAB_0016f299;
          lVar30 = lVar30 + 1;
        } while (lVar30 != 0x40);
        cVar27 = '\0';
LAB_0016f299:
        if (cVar27 == '\0') goto LAB_0016f9d4;
        lVar30 = 0;
        do {
          bVar1 = *(byte *)((long)local_40c8.x.n + lVar30);
          iVar28 = (uint)bVar1 - (uint)(byte)local_4128[lVar30];
          if (bVar1 != local_4128[lVar30]) goto LAB_0016f2c9;
          lVar30 = lVar30 + 1;
        } while (lVar30 != 0x40);
        iVar28 = 0;
LAB_0016f2c9:
        if (iVar28 != 0) goto LAB_0016f9d9;
        in_R8 = (code *)0x0;
        iVar28 = secp256k1_ecdsa_sign
                           (CTX,(secp256k1_ecdsa_signature *)local_4128,(uchar *)r_00,local_4178,
                            (secp256k1_nonce_function)0x0,r);
        if (iVar28 != 1) goto LAB_0016f9de;
        lVar30 = 0;
        do {
          cVar27 = local_4128[lVar30];
          if (cVar27 != '\0') goto LAB_0016f30e;
          lVar30 = lVar30 + 1;
        } while (lVar30 != 0x40);
        cVar27 = '\0';
LAB_0016f30e:
        if (cVar27 == '\0') goto LAB_0016f9e3;
        lVar30 = 0;
        do {
          bVar1 = *(byte *)((long)local_40c8.x.n + lVar30);
          iVar28 = (uint)bVar1 - (uint)(byte)local_4128[lVar30];
          if (bVar1 != local_4128[lVar30]) goto LAB_0016f33e;
          lVar30 = lVar30 + 1;
        } while (lVar30 != 0x40);
        iVar28 = 0;
LAB_0016f33e:
        if (iVar28 != 0) goto LAB_0016f9e8;
        lVar30 = 0;
        signature = (secp256k1_ge *)0x0;
        do {
          local_4148[0] = (char)signature;
          in_R8 = (code *)0x0;
          iVar28 = secp256k1_ecdsa_sign
                             (CTX,(secp256k1_ecdsa_signature *)local_4128,(uchar *)r_00,local_4178,
                              (secp256k1_nonce_function)0x0,r);
          if (iVar28 != 1) goto LAB_0016f993;
          lVar31 = 0;
          do {
            cVar27 = local_4128[lVar31];
            if (cVar27 != '\0') goto LAB_0016f38e;
            lVar31 = lVar31 + 1;
          } while (lVar31 != 0x40);
          cVar27 = '\0';
LAB_0016f38e:
          if (cVar27 == '\0') goto LAB_0016f998;
          local_4038[0].x.n[(long)signature * 4 + 2] = local_4118;
          local_4038[0].y.n[(long)signature * 4 + -2] = uStack_4110;
          local_4038[0].x.n[(long)signature * 4] = _local_4128;
          local_4038[0].x.n[(long)signature * 4 + 1] = auStack_4124._4_8_;
          if (signature != (secp256k1_ge *)0x0) {
            lVar31 = 0;
            do {
              if ((((local_4038[0].x.n[(long)signature * 4] ==
                     *(uint64_t *)((long)local_4038[0].x.n + lVar31)) &&
                   (local_4038[0].x.n[(long)signature * 4 + 1] ==
                    *(uint64_t *)((long)local_4038[0].x.n + lVar31 + 8))) &&
                  (local_4038[0].x.n[(long)signature * 4 + 2] ==
                   *(uint64_t *)((long)local_4038[0].x.n + lVar31 + 0x10))) &&
                 (local_4038[0].y.n[(long)signature * 4 + -2] ==
                  *(uint64_t *)((long)local_4038[0].x.n + lVar31 + 0x18))) goto LAB_0016f98e;
              lVar31 = lVar31 + 0x20;
            } while (lVar30 != lVar31);
          }
          signature = (secp256k1_ge *)((long)(signature->x).n + 1);
          lVar30 = lVar30 + 0x20;
        } while (signature != (secp256k1_ge *)0x100);
        auVar25[0xf] = 0;
        auVar25._0_15_ = stack0xffffffffffffbeb9;
        _local_4148 = auVar25 << 8;
        auStack_4138[0xf] = 2;
        signature = (secp256k1_ge *)0x100;
        lVar30 = 0x2000;
        do {
          local_4178[0] = (char)signature;
          in_R8 = (code *)0x0;
          iVar28 = secp256k1_ecdsa_sign
                             (CTX,(secp256k1_ecdsa_signature *)local_4128,(uchar *)r_00,local_4178,
                              (secp256k1_nonce_function)0x0,r);
          if (iVar28 != 1) goto LAB_0016f99d;
          lVar31 = 0;
          do {
            cVar27 = local_4128[lVar31];
            if (cVar27 != '\0') goto LAB_0016f47a;
            lVar31 = lVar31 + 1;
          } while (lVar31 != 0x40);
          cVar27 = '\0';
LAB_0016f47a:
          if (cVar27 == '\0') goto LAB_0016f9a2;
          local_4038[0].x.n[(long)signature * 4] = _local_4128;
          local_4038[0].x.n[(long)signature * 4 + 1] = auStack_4124._4_8_;
          local_4038[0].x.n[(long)signature * 4 + 2] = local_4118;
          local_4038[0].y.n[(long)signature * 4 + -2] = uStack_4110;
          lVar31 = 0;
          do {
            if (((local_4038[0].x.n[(long)signature * 4] ==
                  *(uint64_t *)((long)local_4038[0].x.n + lVar31)) &&
                (local_4038[0].x.n[(long)signature * 4 + 1] ==
                 *(uint64_t *)((long)local_4038[0].x.n + lVar31 + 8))) &&
               ((local_4038[0].x.n[(long)signature * 4 + 2] ==
                 *(uint64_t *)((long)local_4038[0].x.n + lVar31 + 0x10) &&
                (local_4038[0].y.n[(long)signature * 4 + -2] ==
                 *(uint64_t *)((long)local_4038[0].x.n + lVar31 + 0x18))))) {
              test_ecdsa_edge_cases_cold_48();
LAB_0016f98e:
              test_ecdsa_edge_cases_cold_46();
              goto LAB_0016f993;
            }
            lVar31 = lVar31 + 0x20;
          } while (lVar30 != lVar31);
          signature = (secp256k1_ge *)((long)(signature->x).n + 1);
          lVar30 = lVar30 + 0x20;
        } while (signature != (secp256k1_ge *)0x200);
        uVar29 = (ulong)((int)local_4040 + 1);
      } while ((int)local_4040 == 0);
      in_R8 = (code *)local_4128;
      local_4118 = 0;
      uStack_4110 = 0;
      _local_4128 = (undefined1  [16])0x0;
      lVar30 = 0;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = auStack_4144._4_8_;
      _local_4148 = auVar26 << 0x40;
      local_40e8.d[0] = 0;
      local_4068[0] = 0;
      local_4068[1] = 0;
      local_4068[2] = 0;
      local_4068[3] = 0;
      local_4068[4] = 0;
      local_4068[5] = 0;
      local_4068[6] = 0;
      local_4068[7] = 0;
      local_4038[0].x.n[0] = 0x4d430001;
      local_4038[0].x.n[1] = (uint64_t)local_4068;
      local_4038[0].x.n[2] = 0x20;
      local_4038[0].x.n[3] = 0;
      local_4038[0].x.n[4] = 0;
      local_4038[0].y.n[0] = 0;
      local_4150 = 0;
      nonce_function_rfc6979(local_4178,(uchar *)in_R8,(uchar *)in_R8,(uchar *)0x0,(void *)0x0,0);
      local_4038[0].x.n[0] = 0x4d430005;
      local_4038[0].x.n[2] = 0x20;
      local_4038[0].x.n[3] = 0;
      local_4038[0].x.n[4] = 0;
      local_4038[0].y.n[0] = 0;
      local_4150 = 0;
      local_4038[0].x.n[1] = (uint64_t)local_4178;
      nonce_function_rfc6979
                ((uchar *)r_00,(uchar *)in_R8,(uchar *)in_R8,(uchar *)in_R8,(void *)0x0,0);
      local_4038[0].x.n[0] = 0x4d430005;
      local_4038[0].x.n[2] = 0x20;
      local_4038[0].x.n[3] = 0;
      local_4038[0].x.n[4] = 0;
      local_4038[0].y.n[0] = 0;
      local_4150 = 0;
      local_4038[0].x.n[1] = (uint64_t)r_00;
      nonce_function_rfc6979
                ((uchar *)&local_40e8,(uchar *)in_R8,(uchar *)in_R8,(uchar *)0x0,in_R8,0);
      local_4038[0].x.n[0] = 0x4d430005;
      local_4038[0].x.n[2] = 0x20;
      local_4038[0].x.n[3] = 0;
      local_4038[0].x.n[4] = 0;
      local_4038[0].y.n[0] = 0;
      local_4150 = 0;
      pbVar33 = local_4068;
      local_4038[0].x.n[1] = (uint64_t)&local_40e8;
      nonce_function_rfc6979(local_4068,(uchar *)in_R8,(uchar *)in_R8,(uchar *)in_R8,in_R8,0);
      local_4038[0].x.n[0] = 0x4d430005;
      local_4038[0].x.n[1] = (uint64_t)local_4068;
      local_4038[0].x.n[2] = 0x20;
      local_4038[0].x.n[3] = 0;
      local_4038[0].x.n[4] = 0;
      local_4038[0].y.n[0] = 0;
      uVar29 = (ulong)((long)pbVar33 << 3) >> 0x33;
      uVar3 = (((long)pbVar33 << 3 | (ulong)pbVar33 >> 0x3d) << 0xd | uVar29) >> 3;
      psVar34 = (secp256k1_context *)(uVar3 << 0x33 | (uVar29 << 0x3d | uVar3) >> 0xd);
      local_4150 = 0;
      do {
        iVar28 = (uint)(byte)local_4178[lVar30] - (uint)(byte)local_4148[lVar30];
        if (local_4178[lVar30] != local_4148[lVar30]) goto LAB_0016f80a;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 0x20);
      iVar28 = 0;
LAB_0016f80a:
      if (iVar28 == 0) {
LAB_0016fcc3:
        test_ecdsa_edge_cases_cold_56();
LAB_0016fcc8:
        test_ecdsa_edge_cases_cold_55();
LAB_0016fccd:
        test_ecdsa_edge_cases_cold_54();
LAB_0016fcd2:
        test_ecdsa_edge_cases_cold_53();
LAB_0016fcd7:
        test_ecdsa_edge_cases_cold_52();
LAB_0016fcdc:
        test_ecdsa_edge_cases_cold_51();
      }
      else {
        lVar30 = 0;
        do {
          bVar1 = *(byte *)((long)local_40e8.d + lVar30);
          psVar34 = (secp256k1_context *)(ulong)bVar1;
          iVar28 = (uint)(byte)local_4178[lVar30] - (uint)bVar1;
          if (local_4178[lVar30] != bVar1) goto LAB_0016f839;
          lVar30 = lVar30 + 1;
        } while (lVar30 != 0x20);
        iVar28 = 0;
LAB_0016f839:
        if (iVar28 == 0) goto LAB_0016fcc8;
        lVar30 = 0;
        do {
          bVar1 = local_4068[lVar30];
          psVar34 = (secp256k1_context *)(ulong)bVar1;
          iVar28 = (uint)(byte)local_4178[lVar30] - (uint)bVar1;
          if (local_4178[lVar30] != bVar1) goto LAB_0016f868;
          lVar30 = lVar30 + 1;
        } while (lVar30 != 0x20);
        iVar28 = 0;
LAB_0016f868:
        if (iVar28 == 0) goto LAB_0016fccd;
        lVar30 = 0;
        do {
          bVar1 = *(byte *)((long)local_40e8.d + lVar30);
          psVar34 = (secp256k1_context *)(ulong)bVar1;
          iVar28 = (uint)(byte)local_4148[lVar30] - (uint)bVar1;
          if (local_4148[lVar30] != bVar1) goto LAB_0016f898;
          lVar30 = lVar30 + 1;
        } while (lVar30 != 0x20);
        iVar28 = 0;
LAB_0016f898:
        if (iVar28 == 0) goto LAB_0016fcd2;
        lVar30 = 0;
        do {
          bVar1 = local_4068[lVar30];
          psVar34 = (secp256k1_context *)(ulong)bVar1;
          iVar28 = (uint)(byte)local_4148[lVar30] - (uint)bVar1;
          if (local_4148[lVar30] != bVar1) goto LAB_0016f8c8;
          lVar30 = lVar30 + 1;
        } while (lVar30 != 0x20);
        iVar28 = 0;
LAB_0016f8c8:
        if (iVar28 == 0) goto LAB_0016fcd7;
        lVar30 = 0;
        do {
          bVar1 = *(byte *)((long)local_40e8.d + lVar30);
          bVar2 = local_4068[lVar30];
          psVar34 = (secp256k1_context *)(ulong)bVar2;
          iVar28 = (uint)bVar1 - (uint)bVar2;
          if (bVar1 != bVar2) goto LAB_0016f8fb;
          lVar30 = lVar30 + 1;
        } while (lVar30 != 0x20);
        iVar28 = 0;
LAB_0016f8fb:
        if (iVar28 == 0) goto LAB_0016fcdc;
        local_4118._0_1_ = 0xba;
        local_4118._1_1_ = 0xae;
        local_4118._2_1_ = 0xdc;
        local_4118._3_1_ = 0xe6;
        local_4118._4_1_ = 0xaf;
        local_4118._5_1_ = 'H';
        local_4118._6_1_ = 0xa0;
        local_4118._7_1_ = ';';
        uStack_4110._0_1_ = 0xbf;
        uStack_4110._1_1_ = 0xd2;
        uStack_4110._2_1_ = '^';
        uStack_4110._3_1_ = 0x8c;
        uStack_4110._4_1_ = 0xd0;
        uStack_4110._5_1_ = '6';
        uStack_4110._6_1_ = 'A';
        uStack_4110._7_1_ = 'A';
        auStack_4124[4] = 0xff;
        auStack_4124[5] = 0xff;
        auStack_4124[6] = 0xff;
        auStack_4124[7] = 0xff;
        auStack_4124[8] = 0xff;
        auStack_4124[9] = 0xff;
        auStack_4124[10] = 0xff;
        auStack_4124[0xb] = 0xfe;
        local_4128[0] = 0xff;
        local_4128[1] = 0xff;
        local_4128[2] = 0xff;
        local_4128[3] = 0xff;
        auStack_4124[0] = 0xff;
        auStack_4124[1] = 0xff;
        auStack_4124[2] = 0xff;
        auStack_4124[3] = 0xff;
        local_4178 = (undefined1  [8])0x12c;
        in_R8 = (code *)0x0;
        psVar34 = CTX;
        iVar28 = ec_privkey_export_der(CTX,(uchar *)local_4038,(size_t *)local_4178,local_4128,0);
        if (iVar28 == 0) {
          local_4178 = (undefined1  [8])0x12c;
          in_R8 = (code *)0x1;
          psVar34 = CTX;
          iVar28 = ec_privkey_export_der(CTX,(uchar *)local_4038,(size_t *)local_4178,local_4128,1);
          if (iVar28 == 0) {
            return;
          }
          goto LAB_0016fce6;
        }
      }
      test_ecdsa_edge_cases_cold_49();
LAB_0016fce6:
      test_ecdsa_edge_cases_cold_50();
      uVar4 = *(undefined8 *)in_R8;
      uVar5 = *(uint64_t *)(in_R8 + 8);
      uVar6 = *(uint64_t *)(in_R8 + 0x18);
      (psVar34->ecmult_gen_ctx).scalar_offset.d[1] = *(uint64_t *)(in_R8 + 0x10);
      (psVar34->ecmult_gen_ctx).scalar_offset.d[2] = uVar6;
      *(undefined8 *)&psVar34->ecmult_gen_ctx = uVar4;
      (psVar34->ecmult_gen_ctx).scalar_offset.d[0] = uVar5;
      return;
    }
  }
  else {
    test_ecdsa_edge_cases_cold_32();
LAB_0016fcb9:
    test_ecdsa_edge_cases_cold_62();
  }
  test_ecdsa_edge_cases_cold_33();
  goto LAB_0016fcc3;
LAB_0016f993:
  test_ecdsa_edge_cases_cold_45();
LAB_0016f998:
  test_ecdsa_edge_cases_cold_58();
LAB_0016f99d:
  test_ecdsa_edge_cases_cold_47();
LAB_0016f9a2:
  test_ecdsa_edge_cases_cold_57();
LAB_0016f9a7:
  test_ecdsa_edge_cases_cold_34();
LAB_0016f9ac:
  test_ecdsa_edge_cases_cold_35();
LAB_0016f9b1:
  test_ecdsa_edge_cases_cold_36();
LAB_0016f9b6:
  test_ecdsa_edge_cases_cold_37();
LAB_0016f9bb:
  test_ecdsa_edge_cases_cold_38();
LAB_0016f9c0:
  test_ecdsa_edge_cases_cold_39();
LAB_0016f9c5:
  test_ecdsa_edge_cases_cold_40();
LAB_0016f9ca:
  test_ecdsa_edge_cases_cold_61();
LAB_0016f9cf:
  test_ecdsa_edge_cases_cold_41();
LAB_0016f9d4:
  test_ecdsa_edge_cases_cold_60();
LAB_0016f9d9:
  test_ecdsa_edge_cases_cold_42();
LAB_0016f9de:
  test_ecdsa_edge_cases_cold_43();
LAB_0016f9e3:
  test_ecdsa_edge_cases_cold_59();
LAB_0016f9e8:
  test_ecdsa_edge_cases_cold_44();
LAB_0016f9ed:
  test_ecdsa_edge_cases_cold_1();
LAB_0016f9f2:
  test_ecdsa_edge_cases_cold_83();
LAB_0016f9f7:
  test_ecdsa_edge_cases_cold_2();
LAB_0016f9fc:
  test_ecdsa_edge_cases_cold_82();
LAB_0016fa01:
  test_ecdsa_edge_cases_cold_3();
LAB_0016fa06:
  test_ecdsa_edge_cases_cold_81();
LAB_0016fa0b:
  test_ecdsa_edge_cases_cold_80();
LAB_0016fa10:
  test_ecdsa_edge_cases_cold_79();
LAB_0016fa15:
  test_ecdsa_edge_cases_cold_78();
LAB_0016fa1a:
  test_ecdsa_edge_cases_cold_77();
LAB_0016fa1f:
  test_ecdsa_edge_cases_cold_76();
LAB_0016fa24:
  test_ecdsa_edge_cases_cold_4();
LAB_0016fa29:
  test_ecdsa_edge_cases_cold_5();
LAB_0016fa2e:
  test_ecdsa_edge_cases_cold_75();
LAB_0016fa33:
  test_ecdsa_edge_cases_cold_74();
LAB_0016fa38:
  test_ecdsa_edge_cases_cold_73();
LAB_0016fa3d:
  test_ecdsa_edge_cases_cold_72();
LAB_0016fa42:
  test_ecdsa_edge_cases_cold_71();
LAB_0016fa47:
  test_ecdsa_edge_cases_cold_70();
LAB_0016fa4c:
  test_ecdsa_edge_cases_cold_6();
LAB_0016fa51:
  test_ecdsa_edge_cases_cold_7();
LAB_0016fa56:
  test_ecdsa_edge_cases_cold_69();
LAB_0016fa5b:
  test_ecdsa_edge_cases_cold_68();
LAB_0016fa60:
  a = r;
  test_ecdsa_edge_cases_cold_67();
LAB_0016fa65:
  test_ecdsa_edge_cases_cold_8();
LAB_0016fa6a:
  test_ecdsa_edge_cases_cold_9();
LAB_0016fa6f:
  test_ecdsa_edge_cases_cold_10();
LAB_0016fa74:
  test_ecdsa_edge_cases_cold_11();
  psVar34 = extraout_RAX;
LAB_0016fa79:
  (*(psVar34->illegal_callback).fn)
            ("ctx != secp256k1_context_static",(psVar34->illegal_callback).data);
  goto LAB_0016e6dd;
}

Assistant:

static void test_ecdsa_edge_cases(void) {
    int t;
    secp256k1_ecdsa_signature sig;

    /* Test the case where ECDSA recomputes a point that is infinity. */
    {
        secp256k1_gej keyj;
        secp256k1_ge key;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 1);
        secp256k1_scalar_negate(&ss, &ss);
        secp256k1_scalar_inverse(&ss, &ss);
        secp256k1_scalar_set_int(&sr, 1);
        secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &keyj, &sr);
        secp256k1_ge_set_gej(&key, &keyj);
        msg = ss;
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
    }

    /* Verify signature with r of zero fails. */
    {
        const unsigned char pubkey_mods_zero[33] = {
            0x02, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xfe, 0xba, 0xae, 0xdc, 0xe6, 0xaf, 0x48, 0xa0,
            0x3b, 0xbf, 0xd2, 0x5e, 0x8c, 0xd0, 0x36, 0x41,
            0x41
        };
        secp256k1_ge key;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 1);
        secp256k1_scalar_set_int(&msg, 0);
        secp256k1_scalar_set_int(&sr, 0);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey_mods_zero, 33));
        CHECK(secp256k1_ecdsa_sig_verify( &sr, &ss, &key, &msg) == 0);
    }

    /* Verify signature with s of zero fails. */
    {
        const unsigned char pubkey[33] = {
            0x02, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x01
        };
        secp256k1_ge key;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 0);
        secp256k1_scalar_set_int(&msg, 0);
        secp256k1_scalar_set_int(&sr, 1);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey, 33));
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
    }

    /* Verify signature with message 0 passes. */
    {
        const unsigned char pubkey[33] = {
            0x02, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x02
        };
        const unsigned char pubkey2[33] = {
            0x02, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xfe, 0xba, 0xae, 0xdc, 0xe6, 0xaf, 0x48, 0xa0,
            0x3b, 0xbf, 0xd2, 0x5e, 0x8c, 0xd0, 0x36, 0x41,
            0x43
        };
        secp256k1_ge key;
        secp256k1_ge key2;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 2);
        secp256k1_scalar_set_int(&msg, 0);
        secp256k1_scalar_set_int(&sr, 2);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey, 33));
        CHECK(secp256k1_eckey_pubkey_parse(&key2, pubkey2, 33));
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1);
        secp256k1_scalar_negate(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1);
        secp256k1_scalar_set_int(&ss, 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 0);
    }

    /* Verify signature with message 1 passes. */
    {
        const unsigned char pubkey[33] = {
            0x02, 0x14, 0x4e, 0x5a, 0x58, 0xef, 0x5b, 0x22,
            0x6f, 0xd2, 0xe2, 0x07, 0x6a, 0x77, 0xcf, 0x05,
            0xb4, 0x1d, 0xe7, 0x4a, 0x30, 0x98, 0x27, 0x8c,
            0x93, 0xe6, 0xe6, 0x3c, 0x0b, 0xc4, 0x73, 0x76,
            0x25
        };
        const unsigned char pubkey2[33] = {
            0x02, 0x8a, 0xd5, 0x37, 0xed, 0x73, 0xd9, 0x40,
            0x1d, 0xa0, 0x33, 0xd2, 0xdc, 0xf0, 0xaf, 0xae,
            0x34, 0xcf, 0x5f, 0x96, 0x4c, 0x73, 0x28, 0x0f,
            0x92, 0xc0, 0xf6, 0x9d, 0xd9, 0xb2, 0x09, 0x10,
            0x62
        };
        const unsigned char csr[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01,
            0x45, 0x51, 0x23, 0x19, 0x50, 0xb7, 0x5f, 0xc4,
            0x40, 0x2d, 0xa1, 0x72, 0x2f, 0xc9, 0xba, 0xeb
        };
        secp256k1_ge key;
        secp256k1_ge key2;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 1);
        secp256k1_scalar_set_int(&msg, 1);
        secp256k1_scalar_set_b32(&sr, csr, NULL);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey, 33));
        CHECK(secp256k1_eckey_pubkey_parse(&key2, pubkey2, 33));
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1);
        secp256k1_scalar_negate(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1);
        secp256k1_scalar_set_int(&ss, 2);
        secp256k1_scalar_inverse_var(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 0);
    }

    /* Verify signature with message -1 passes. */
    {
        const unsigned char pubkey[33] = {
            0x03, 0xaf, 0x97, 0xff, 0x7d, 0x3a, 0xf6, 0xa0,
            0x02, 0x94, 0xbd, 0x9f, 0x4b, 0x2e, 0xd7, 0x52,
            0x28, 0xdb, 0x49, 0x2a, 0x65, 0xcb, 0x1e, 0x27,
            0x57, 0x9c, 0xba, 0x74, 0x20, 0xd5, 0x1d, 0x20,
            0xf1
        };
        const unsigned char csr[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01,
            0x45, 0x51, 0x23, 0x19, 0x50, 0xb7, 0x5f, 0xc4,
            0x40, 0x2d, 0xa1, 0x72, 0x2f, 0xc9, 0xba, 0xee
        };
        secp256k1_ge key;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 1);
        secp256k1_scalar_set_int(&msg, 1);
        secp256k1_scalar_negate(&msg, &msg);
        secp256k1_scalar_set_b32(&sr, csr, NULL);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey, 33));
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        secp256k1_scalar_negate(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        secp256k1_scalar_set_int(&ss, 3);
        secp256k1_scalar_inverse_var(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
    }

    /* Signature where s would be zero. */
    {
        secp256k1_pubkey pubkey;
        size_t siglen;
        unsigned char signature[72];
        static const unsigned char nonce[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01,
        };
        static const unsigned char nonce2[32] = {
            0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,
            0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFE,
            0xBA,0xAE,0xDC,0xE6,0xAF,0x48,0xA0,0x3B,
            0xBF,0xD2,0x5E,0x8C,0xD0,0x36,0x41,0x40
        };
        const unsigned char key[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01,
        };
        unsigned char msg[32] = {
            0x86, 0x41, 0x99, 0x81, 0x06, 0x23, 0x44, 0x53,
            0xaa, 0x5f, 0x9d, 0x6a, 0x31, 0x78, 0xf4, 0xf7,
            0xb8, 0x12, 0xe0, 0x0b, 0x81, 0x7a, 0x77, 0x62,
            0x65, 0xdf, 0xdd, 0x31, 0xb9, 0x3e, 0x29, 0xa9,
        };
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce) == 0);
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce2) == 0);
        msg[31] = 0xaa;
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce) == 1);
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_sign(CTX, NULL, msg, key, precomputed_nonce_function, nonce2));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_sign(CTX, &sig, NULL, key, precomputed_nonce_function, nonce2));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_sign(CTX, &sig, msg, NULL, precomputed_nonce_function, nonce2));
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce2) == 1);
        CHECK(secp256k1_ec_pubkey_create(CTX, &pubkey, key) == 1);
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_verify(CTX, NULL, msg, &pubkey));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_verify(CTX, &sig, NULL, &pubkey));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_verify(CTX, &sig, msg, NULL));
        CHECK(secp256k1_ecdsa_verify(CTX, &sig, msg, &pubkey) == 1);
        CHECK_ILLEGAL(CTX, secp256k1_ec_pubkey_create(CTX, &pubkey, NULL));
        /* That pubkeyload fails via an ARGCHECK is a little odd but makes sense because pubkeys are an opaque data type. */
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_verify(CTX, &sig, msg, &pubkey));
        siglen = 72;
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_serialize_der(CTX, NULL, &siglen, &sig));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_serialize_der(CTX, signature, NULL, &sig));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_serialize_der(CTX, signature, &siglen, NULL));
        CHECK(secp256k1_ecdsa_signature_serialize_der(CTX, signature, &siglen, &sig) == 1);
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_parse_der(CTX, NULL, signature, siglen));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_parse_der(CTX, &sig, NULL, siglen));
        CHECK(secp256k1_ecdsa_signature_parse_der(CTX, &sig, signature, siglen) == 1);
        siglen = 10;
        /* Too little room for a signature does not fail via ARGCHECK. */
        CHECK(secp256k1_ecdsa_signature_serialize_der(CTX, signature, &siglen, &sig) == 0);
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_normalize(CTX, NULL, NULL));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_serialize_compact(CTX, NULL, &sig));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_serialize_compact(CTX, signature, NULL));
        CHECK(secp256k1_ecdsa_signature_serialize_compact(CTX, signature, &sig) == 1);
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_parse_compact(CTX, NULL, signature));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_parse_compact(CTX, &sig, NULL));
        CHECK(secp256k1_ecdsa_signature_parse_compact(CTX, &sig, signature) == 1);
        memset(signature, 255, 64);
        CHECK(secp256k1_ecdsa_signature_parse_compact(CTX, &sig, signature) == 0);
    }

    /* Nonce function corner cases. */
    for (t = 0; t < 2; t++) {
        static const unsigned char zero[32] = {0x00};
        int i;
        unsigned char key[32];
        unsigned char msg[32];
        secp256k1_ecdsa_signature sig2;
        secp256k1_scalar sr[512], ss;
        const unsigned char *extra;
        extra = t == 0 ? NULL : zero;
        memset(msg, 0, 32);
        msg[31] = 1;
        /* High key results in signature failure. */
        memset(key, 0xFF, 32);
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, NULL, extra) == 0);
        CHECK(is_empty_signature(&sig));
        /* Zero key results in signature failure. */
        memset(key, 0, 32);
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, NULL, extra) == 0);
        CHECK(is_empty_signature(&sig));
        /* Nonce function failure results in signature failure. */
        key[31] = 1;
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, nonce_function_test_fail, extra) == 0);
        CHECK(is_empty_signature(&sig));
        /* The retry loop successfully makes its way to the first good value. */
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, nonce_function_test_retry, extra) == 1);
        CHECK(!is_empty_signature(&sig));
        CHECK(secp256k1_ecdsa_sign(CTX, &sig2, msg, key, nonce_function_rfc6979, extra) == 1);
        CHECK(!is_empty_signature(&sig2));
        CHECK(secp256k1_memcmp_var(&sig, &sig2, sizeof(sig)) == 0);
        /* The default nonce function is deterministic. */
        CHECK(secp256k1_ecdsa_sign(CTX, &sig2, msg, key, NULL, extra) == 1);
        CHECK(!is_empty_signature(&sig2));
        CHECK(secp256k1_memcmp_var(&sig, &sig2, sizeof(sig)) == 0);
        /* The default nonce function changes output with different messages. */
        for(i = 0; i < 256; i++) {
            int j;
            msg[0] = i;
            CHECK(secp256k1_ecdsa_sign(CTX, &sig2, msg, key, NULL, extra) == 1);
            CHECK(!is_empty_signature(&sig2));
            secp256k1_ecdsa_signature_load(CTX, &sr[i], &ss, &sig2);
            for (j = 0; j < i; j++) {
                CHECK(!secp256k1_scalar_eq(&sr[i], &sr[j]));
            }
        }
        msg[0] = 0;
        msg[31] = 2;
        /* The default nonce function changes output with different keys. */
        for(i = 256; i < 512; i++) {
            int j;
            key[0] = i - 256;
            CHECK(secp256k1_ecdsa_sign(CTX, &sig2, msg, key, NULL, extra) == 1);
            CHECK(!is_empty_signature(&sig2));
            secp256k1_ecdsa_signature_load(CTX, &sr[i], &ss, &sig2);
            for (j = 0; j < i; j++) {
                CHECK(!secp256k1_scalar_eq(&sr[i], &sr[j]));
            }
        }
        key[0] = 0;
    }

    {
        /* Check that optional nonce arguments do not have equivalent effect. */
        const unsigned char zeros[32] = {0};
        unsigned char nonce[32];
        unsigned char nonce2[32];
        unsigned char nonce3[32];
        unsigned char nonce4[32];
        SECP256K1_CHECKMEM_UNDEFINE(nonce,32);
        SECP256K1_CHECKMEM_UNDEFINE(nonce2,32);
        SECP256K1_CHECKMEM_UNDEFINE(nonce3,32);
        SECP256K1_CHECKMEM_UNDEFINE(nonce4,32);
        CHECK(nonce_function_rfc6979(nonce, zeros, zeros, NULL, NULL, 0) == 1);
        SECP256K1_CHECKMEM_CHECK(nonce,32);
        CHECK(nonce_function_rfc6979(nonce2, zeros, zeros, zeros, NULL, 0) == 1);
        SECP256K1_CHECKMEM_CHECK(nonce2,32);
        CHECK(nonce_function_rfc6979(nonce3, zeros, zeros, NULL, (void *)zeros, 0) == 1);
        SECP256K1_CHECKMEM_CHECK(nonce3,32);
        CHECK(nonce_function_rfc6979(nonce4, zeros, zeros, zeros, (void *)zeros, 0) == 1);
        SECP256K1_CHECKMEM_CHECK(nonce4,32);
        CHECK(secp256k1_memcmp_var(nonce, nonce2, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce, nonce3, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce, nonce4, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce2, nonce3, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce2, nonce4, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce3, nonce4, 32) != 0);
    }


    /* Privkey export where pubkey is the point at infinity. */
    {
        unsigned char privkey[300];
        unsigned char seckey[32] = {
            0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xfe,
            0xba, 0xae, 0xdc, 0xe6, 0xaf, 0x48, 0xa0, 0x3b,
            0xbf, 0xd2, 0x5e, 0x8c, 0xd0, 0x36, 0x41, 0x41,
        };
        size_t outlen = 300;
        CHECK(!ec_privkey_export_der(CTX, privkey, &outlen, seckey, 0));
        outlen = 300;
        CHECK(!ec_privkey_export_der(CTX, privkey, &outlen, seckey, 1));
    }
}